

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O1

token * dmrC_conditional_expression(dmr_C *C,token *token,expression **tree)

{
  expression **tree_00;
  expression **tree_01;
  position pVar1;
  expression *peVar2;
  int iVar3;
  byte bVar7;
  token *ptVar4;
  expression *peVar5;
  char *pcVar6;
  expression *peVar8;
  expression *local_48;
  expression *right;
  expression *local_38;
  expression *left;
  
  local_38 = (expression *)0x0;
  ptVar4 = logical_and_expression(C,token,&local_38);
  if (local_38 != (expression *)0x0) {
    peVar8 = local_38;
    right = (expression *)tree;
    do {
      tree = (expression **)right;
      if (((ulong)ptVar4->pos & 0x3f) != 0x11) goto LAB_00108ba9;
      local_48 = (expression *)0x0;
      iVar3 = 4;
      if ((ptVar4->field_2).special == 0x10e) {
        pVar1 = ptVar4->pos;
        peVar5 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
        *(undefined1 *)peVar5 = 7;
        peVar5->pos = pVar1;
        ptVar4 = logical_and_expression(C,ptVar4->next,&local_48);
        if (local_48 == (expression *)0x0) {
          pcVar6 = dmrC_show_special(C,0x10e);
          dmrC_sparse_error(C,ptVar4->pos,"No right hand side of \'%s\'-expression",pcVar6);
          iVar3 = 3;
        }
        else {
          peVar5->field_0x1 =
               (byte)((ushort)*(undefined2 *)peVar8 >> 8) &
               (byte)((ushort)*(undefined2 *)local_48 >> 8) & 1;
          peVar5->op = 0x10e;
          (peVar5->field_5).field_3.unop = peVar8;
          (peVar5->field_5).field_2.string = (string *)local_48;
          iVar3 = 0;
          peVar8 = peVar5;
          local_38 = peVar5;
        }
      }
    } while (iVar3 == 0);
    tree = (expression **)right;
    if (1 < iVar3 - 3U) goto LAB_00108bb0;
  }
LAB_00108ba9:
  *tree = local_38;
LAB_00108bb0:
  if (((*tree != (expression *)0x0) && (pVar1 = ptVar4->pos, (pVar1._0_4_ & 0x3f) == 0x11)) &&
     ((ptVar4->field_2).special == 0x3f)) {
    peVar5 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)peVar5 = 0x11;
    peVar5->pos = pVar1;
    peVar5->op = (ptVar4->field_2).special;
    (peVar5->field_5).expr_list = (expression_list *)*tree;
    *tree = peVar5;
    tree_00 = &(peVar5->field_5).field_6.right;
    ptVar4 = comma_expression(C,ptVar4->next,tree_00);
    ptVar4 = dmrC_expect_token(C,ptVar4,0x3a,"in conditional expression");
    tree_01 = &(peVar5->field_5).field_10.cond_false;
    ptVar4 = dmrC_conditional_expression(C,ptVar4,tree_01);
    peVar8 = (peVar5->field_5).field_3.unop;
    if ((peVar8 != (expression *)0x0) && (peVar2 = *tree_01, peVar2 != (expression *)0x0)) {
      bVar7 = (byte)((ushort)*(undefined2 *)peVar2 >> 8) &
              (byte)((ushort)*(undefined2 *)peVar8 >> 8);
      peVar8 = *tree_00;
      if (peVar8 != (expression *)0x0) {
        bVar7 = bVar7 & (byte)((ushort)*(undefined2 *)peVar8 >> 8);
      }
      peVar5->field_0x1 = bVar7 & 1;
    }
  }
  return ptVar4;
}

Assistant:

struct token *dmrC_conditional_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	token = logical_or_expression(C, token, tree);
	if (*tree && dmrC_match_op(token, '?')) {
		struct expression *expr = dmrC_alloc_expression(C, token->pos, EXPR_CONDITIONAL);
		expr->op = token->special;
		expr->left = *tree;
		*tree = expr;
		token = dmrC_parse_expression(C, token->next, &expr->cond_true);
		token = dmrC_expect_token(C, token, ':', "in conditional expression");
		token = dmrC_conditional_expression(C, token, &expr->cond_false);
		if (expr->left && expr->cond_false) {
			int is_const = expr->left->flags &
					expr->cond_false->flags &
					Int_const_expr;
			if (expr->cond_true)
				is_const &= expr->cond_true->flags;
			expr->flags = is_const;
		}
	}
	return token;
}